

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::detail::Parser::writeToStream(Parser *this,ostream *os)

{
  pointer pbVar1;
  element_type *peVar2;
  pointer pcVar3;
  pointer pAVar4;
  bool bVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  HelpColumns *cols;
  ostream *poVar9;
  undefined4 extraout_var;
  pointer pHVar10;
  ulong uVar11;
  ulong uVar12;
  Arg *arg;
  pointer pAVar13;
  Columns cols_1;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> rows
  ;
  Columns row;
  undefined1 local_118 [24];
  ulong local_100;
  size_t local_f8;
  pointer local_e8;
  size_t local_e0;
  Columns local_d8;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  local_c0;
  value_type local_a8;
  Columns local_78;
  Column local_60;
  
  peVar2 = (this->m_exeName).m_name.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pbVar1 = (pointer)(local_118 + 0x10);
  pcVar3 = (peVar2->_M_dataplus)._M_p;
  local_118._0_8_ = pbVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_118,pcVar3,pcVar3 + peVar2->_M_string_length);
  uVar6 = local_118._8_8_;
  if ((pointer)local_118._0_8_ != pbVar1) {
    operator_delete((void *)local_118._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_118._16_8_)->_M_p + 1));
  }
  if ((pointer)uVar6 != (pointer)0x0) {
    ::std::__ostream_insert<char,std::char_traits<char>>(os,"usage:\n",7);
    ::std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
    peVar2 = (this->m_exeName).m_name.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pcVar3 = (peVar2->_M_dataplus)._M_p;
    local_118._0_8_ = pbVar1;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_118,pcVar3,pcVar3 + peVar2->_M_string_length);
    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                       (os,(char *)local_118._0_8_,local_118._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    if ((pointer)local_118._0_8_ != pbVar1) {
      operator_delete((void *)local_118._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_118._16_8_)->_M_p + 1));
    }
    pAVar13 = (this->m_args).
              super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar4 = (this->m_args).
             super__Vector_base<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pAVar13 != pAVar4) {
      bVar5 = true;
      bVar7 = true;
      do {
        if (!bVar7) {
          ::std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        }
        if (((pAVar13->super_ParserRefImpl<Catch::clara::detail::Arg>).m_optionality == Optional) &&
           (bVar5)) {
          ::std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
          bVar5 = false;
        }
        ::std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
        pcVar3 = (pAVar13->super_ParserRefImpl<Catch::clara::detail::Arg>).m_hint._M_dataplus._M_p;
        local_118._0_8_ = pbVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_118,pcVar3,
                   pcVar3 + (pAVar13->super_ParserRefImpl<Catch::clara::detail::Arg>).m_hint.
                            _M_string_length);
        poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (os,(char *)local_118._0_8_,local_118._8_8_);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,">",1);
        if ((pointer)local_118._0_8_ != pbVar1) {
          operator_delete((void *)local_118._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_118._16_8_)->_M_p + 1));
        }
        iVar8 = (*(pAVar13->super_ParserRefImpl<Catch::clara::detail::Arg>).
                  super_ComposableParserImpl<Catch::clara::detail::Arg>.super_ParserBase.
                  _vptr_ParserBase[4])(pAVar13);
        if (CONCAT44(extraout_var,iVar8) == 0) {
          ::std::__ostream_insert<char,std::char_traits<char>>(os," ... ",5);
        }
        pAVar13 = pAVar13 + 1;
        bVar7 = false;
      } while (pAVar13 != pAVar4);
      if (!bVar5) {
        ::std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
      }
    }
    if ((this->m_options).
        super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (this->m_options).
        super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      ::std::__ostream_insert<char,std::char_traits<char>>(os," options",8);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(os,"\n\nwhere options are:",0x14);
    ::std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    ::std::ostream::put((char)os);
    ::std::ostream::flush();
  }
  getHelpColumns(&local_c0,this);
  if (local_c0.
      super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_c0.
      super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pHVar10 = local_c0.
              super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = 0;
    do {
      uVar12 = (pHVar10->left)._M_string_length + 2;
      if (uVar12 < uVar11) {
        uVar12 = uVar11;
      }
      pHVar10 = pHVar10 + 1;
      uVar11 = uVar12;
    } while (pHVar10 !=
             local_c0.
             super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar11 = 0x28;
    if (uVar12 < 0x28) {
      uVar11 = uVar12;
    }
    if (local_c0.
        super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_c0.
        super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_e0 = 0x49 - uVar11;
      local_e8 = local_c0.
                 super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pHVar10 = local_c0.
                super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        TextFlow::Column::Column((Column *)local_118,&pHVar10->left);
        if (uVar12 == 0) {
          __assert_fail("newWidth > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Toxe[P]catch2-examples/src/single_header/multiple_test_files/include/catch2/catch.hpp"
                        ,0x21a9,"Column &Catch::clara::TextFlow::Column::width(size_t)");
        }
        local_f8 = 2;
        local_100 = uVar11;
        TextFlow::Spacer::Spacer((Spacer *)&local_a8,4);
        local_d8.m_columns.
        super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.m_columns.
        super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_d8.m_columns.
        super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ::push_back(&local_d8.m_columns,(value_type *)local_118);
        std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ::push_back(&local_d8.m_columns,&local_a8);
        TextFlow::Column::Column(&local_60,&pHVar10->right);
        local_60.m_width = local_e0;
        TextFlow::Columns::operator+(&local_78,&local_d8,&local_60);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_60.m_strings);
        std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ::~vector(&local_d8.m_columns);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a8.m_strings);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_118);
        poVar9 = TextFlow::operator<<(os,&local_78);
        ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        ::std::ostream::put((char)poVar9);
        ::std::ostream::flush();
        std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ::~vector(&local_78.m_columns);
        pHVar10 = pHVar10 + 1;
      } while (pHVar10 !=
               local_c0.
               super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::~vector(&local_c0);
  return;
}

Assistant:

void writeToStream( std::ostream &os ) const {
            if (!m_exeName.name().empty()) {
                os << "usage:\n" << "  " << m_exeName.name() << " ";
                bool required = true, first = true;
                for( auto const &arg : m_args ) {
                    if (first)
                        first = false;
                    else
                        os << " ";
                    if( arg.isOptional() && required ) {
                        os << "[";
                        required = false;
                    }
                    os << "<" << arg.hint() << ">";
                    if( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if( !required )
                    os << "]";
                if( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:" << std::endl;
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CLARA_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for( auto const &cols : rows )
                optWidth = (std::max)(optWidth, cols.left.size() + 2);

            optWidth = (std::min)(optWidth, consoleWidth/2);

            for( auto const &cols : rows ) {
                auto row =
                        TextFlow::Column( cols.left ).width( optWidth ).indent( 2 ) +
                        TextFlow::Spacer(4) +
                        TextFlow::Column( cols.right ).width( consoleWidth - 7 - optWidth );
                os << row << std::endl;
            }
        }